

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::add_rule
          (filter_impl<std::array<unsigned_char,_16UL>_> *this,array<unsigned_char,_16UL> first,
          array<unsigned_char,_16UL> last,uint32_t flags)

{
  _Rb_tree_header *p_Var1;
  uint32_t a;
  array<unsigned_char,_16UL> addr;
  bool bVar2;
  iterator __x;
  iterator __x_00;
  _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>
  _Var3;
  array<unsigned_char,_16UL> *__two;
  range *__one;
  uint32_t uVar4;
  array<unsigned_char,_16UL> aVar5;
  array<unsigned_char,_16UL> first_local;
  array<unsigned_char,_16UL> last_local;
  range local_60;
  array<unsigned_char,_16UL> local_48;
  
  last_local._M_elems._8_8_ = last._M_elems._8_8_;
  last_local._M_elems._0_8_ = last._M_elems._0_8_;
  first_local._M_elems._8_8_ = first._M_elems._8_8_;
  first_local._M_elems._0_8_ = first._M_elems._0_8_;
  range::range(&local_60,first,0);
  __x = ::std::
        _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
        ::upper_bound((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
                       *)this,&local_60);
  range::range(&local_60,last,0);
  __x_00 = ::std::
           _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
           ::upper_bound((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
                          *)this,&local_60);
  if (__x._M_node != (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    __x._M_node = (_Base_ptr)::std::_Rb_tree_decrement(__x._M_node);
  }
  uVar4 = *(uint32_t *)&__x._M_node[1]._M_left;
  _Var3 = ::std::
          prev<std::_Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                    (__x_00._M_node,1);
  a = *(uint32_t *)&_Var3._M_node[1]._M_left;
  bVar2 = ::std::operator!=((array<unsigned_char,_16UL> *)(__x._M_node + 1),&first_local);
  if (uVar4 == flags || !bVar2) {
    if (__x._M_node != (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      _Var3 = ::std::
              prev<std::_Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                        (__x._M_node,1);
      if (*(uint32_t *)&_Var3._M_node[1]._M_left == flags) {
        __x._M_node = (_Base_ptr)::std::_Rb_tree_decrement(__x._M_node);
        uVar4 = *(uint32_t *)&__x._M_node[1]._M_left;
      }
    }
  }
  else {
    aVar5._M_elems[8] = first_local._M_elems[8];
    aVar5._M_elems[9] = first_local._M_elems[9];
    aVar5._M_elems[10] = first_local._M_elems[10];
    aVar5._M_elems[0xb] = first_local._M_elems[0xb];
    aVar5._M_elems[0xc] = first_local._M_elems[0xc];
    aVar5._M_elems[0xd] = first_local._M_elems[0xd];
    aVar5._M_elems[0xe] = first_local._M_elems[0xe];
    aVar5._M_elems[0xf] = first_local._M_elems[0xf];
    aVar5._M_elems[0] = first_local._M_elems[0];
    aVar5._M_elems[1] = first_local._M_elems[1];
    aVar5._M_elems[2] = first_local._M_elems[2];
    aVar5._M_elems[3] = first_local._M_elems[3];
    aVar5._M_elems[4] = first_local._M_elems[4];
    aVar5._M_elems[5] = first_local._M_elems[5];
    aVar5._M_elems[6] = first_local._M_elems[6];
    aVar5._M_elems[7] = first_local._M_elems[7];
    range::range(&local_60,aVar5,flags);
    __x = ::std::
          _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
          ::_M_insert_unique_<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>
                    ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                      *)this,__x._M_node,&local_60);
  }
  if (__x._M_node != __x_00._M_node) {
    _Var3 = ::std::
            next<std::_Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                      (__x._M_node,1);
    ::std::
    _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
    ::_M_erase_aux((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
                    *)this,(const_iterator)_Var3._M_node,(const_iterator)__x_00._M_node);
  }
  bVar2 = ::std::operator==((array<unsigned_char,_16UL> *)(__x._M_node + 1),&first_local);
  if (bVar2) {
    *(undefined8 *)(__x._M_node + 1) = first_local._M_elems._0_8_;
    __x._M_node[1]._M_parent = (_Base_ptr)first_local._M_elems._8_8_;
    *(uint32_t *)&__x._M_node[1]._M_left = flags;
  }
  else if (uVar4 != flags) {
    addr._M_elems[8] = first_local._M_elems[8];
    addr._M_elems[9] = first_local._M_elems[9];
    addr._M_elems[10] = first_local._M_elems[10];
    addr._M_elems[0xb] = first_local._M_elems[0xb];
    addr._M_elems[0xc] = first_local._M_elems[0xc];
    addr._M_elems[0xd] = first_local._M_elems[0xd];
    addr._M_elems[0xe] = first_local._M_elems[0xe];
    addr._M_elems[0xf] = first_local._M_elems[0xf];
    addr._M_elems[0] = first_local._M_elems[0];
    addr._M_elems[1] = first_local._M_elems[1];
    addr._M_elems[2] = first_local._M_elems[2];
    addr._M_elems[3] = first_local._M_elems[3];
    addr._M_elems[4] = first_local._M_elems[4];
    addr._M_elems[5] = first_local._M_elems[5];
    addr._M_elems[6] = first_local._M_elems[6];
    addr._M_elems[7] = first_local._M_elems[7];
    range::range(&local_60,addr,flags);
    ::std::
    _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
    ::_M_insert_unique_<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>
              ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                *)this,(const_iterator)__x._M_node,&local_60);
  }
  p_Var1 = &(this->m_access_list)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__x_00._M_node == p_Var1) {
    __two = &local_48;
    local_48._M_elems[0] = 0xff;
    local_48._M_elems[1] = 0xff;
    local_48._M_elems[2] = 0xff;
    local_48._M_elems[3] = 0xff;
    local_48._M_elems[4] = 0xff;
    local_48._M_elems[5] = 0xff;
    local_48._M_elems[6] = 0xff;
    local_48._M_elems[7] = 0xff;
    local_48._M_elems[8] = 0xff;
    local_48._M_elems[9] = 0xff;
    local_48._M_elems[10] = 0xff;
    local_48._M_elems[0xb] = 0xff;
    local_48._M_elems[0xc] = 0xff;
    local_48._M_elems[0xd] = 0xff;
    local_48._M_elems[0xe] = 0xff;
    local_48._M_elems[0xf] = 0xff;
    __one = (range *)&last_local;
  }
  else {
    local_60.start =
         minus_one<std::array<unsigned_char,16ul>>
                   ((array<unsigned_char,_16UL> *)(__x_00._M_node + 1));
    __one = &local_60;
    __two = &last_local;
  }
  bVar2 = ::std::operator!=(&__one->start,__two);
  if ((bVar2) && (a != flags)) {
    aVar5 = plus_one<std::array<unsigned_char,16ul>>(&last_local);
    range::range(&local_60,aVar5,a);
    __x_00 = ::std::
             _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
             ::
             _M_insert_unique_<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>
                       ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                         *)this,__x_00._M_node,&local_60);
  }
  if (((_Rb_tree_header *)__x_00._M_node != p_Var1) &&
     (*(uint32_t *)&__x_00._M_node[1]._M_left == flags)) {
    ::std::
    _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
    ::erase_abi_cxx11_((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                        *)this,(const_iterator)__x_00._M_node);
  }
  return;
}

Assistant:

void filter_impl<Addr>::add_rule(Addr first, Addr last, std::uint32_t const flags)
	{
		TORRENT_ASSERT(!m_access_list.empty());
		TORRENT_ASSERT(first < last || first == last);

		auto i = m_access_list.upper_bound(first);
		auto j = m_access_list.upper_bound(last);

		if (i != m_access_list.begin()) --i;

		TORRENT_ASSERT(j != m_access_list.begin());
		TORRENT_ASSERT(j != i);

		std::uint32_t first_access = i->access;
		std::uint32_t last_access = std::prev(j)->access;

		if (i->start != first && first_access != flags)
		{
			i = m_access_list.insert(i, range(first, flags));
		}
		else if (i != m_access_list.begin() && std::prev(i)->access == flags)
		{
			--i;
			first_access = i->access;
		}
		TORRENT_ASSERT(!m_access_list.empty());
		TORRENT_ASSERT(i != m_access_list.end());

		if (i != j) m_access_list.erase(std::next(i), j);
		if (i->start == first)
		{
			// This is an optimization over erasing and inserting a new element
			// here.
			// this const-cast is OK because we know that the new
			// start address will keep the set correctly ordered
			const_cast<Addr&>(i->start) = first;
			const_cast<std::uint32_t&>(i->access) = flags;
		}
		else if (first_access != flags)
		{
			m_access_list.insert(i, range(first, flags));
		}

		if ((j != m_access_list.end()
				&& minus_one(j->start) != last)
			|| (j == m_access_list.end()
				&& last != max_addr<Addr>()))
		{
			TORRENT_ASSERT(j == m_access_list.end() || last < minus_one(j->start));
			if (last_access != flags)
				j = m_access_list.insert(j, range(plus_one(last), last_access));
		}

		if (j != m_access_list.end() && j->access == flags) m_access_list.erase(j);
		TORRENT_ASSERT(!m_access_list.empty());
	}